

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clacon2.c
# Opt level: O1

int clacon2_(int *n,singlecomplex *v,singlecomplex *x,float *est,int *kase,int *isave)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  double dVar6;
  float fVar7;
  int c__1;
  int local_3c;
  float local_38;
  float local_34;
  
  local_3c = 1;
  local_38 = smach("Safe minimum");
  if (*kase == 0) {
    iVar2 = *n;
    if (0 < (long)iVar2) {
      lVar5 = 0;
      do {
        x[lVar5].r = 1.0 / (float)iVar2;
        x[lVar5].i = 0.0;
        lVar5 = lVar5 + 1;
      } while (iVar2 != lVar5);
    }
    iVar2 = 1;
LAB_00119d8c:
    *kase = iVar2;
    *isave = iVar2;
    return 0;
  }
  switch(*isave) {
  case 2:
    iVar2 = icmax1_slu(n,x,&local_3c);
    isave[1] = iVar2 + -1;
    isave[2] = 2;
    goto LAB_00119de5;
  case 3:
    ccopy_(n,x,&local_3c,v,&local_3c);
    local_34 = *est;
    dVar6 = scsum1_slu(n,v,&local_3c);
    *est = (float)dVar6;
    if (local_34 < (float)dVar6) {
      if (0 < *n) {
        lVar5 = 0;
        do {
          dVar6 = c_abs(x);
          if ((float)dVar6 <= local_38) {
            x->r = 1.0;
            x->i = 0.0;
          }
          else {
            fVar7 = 1.0 / (float)dVar6;
            x->r = x->r * fVar7;
            x->i = fVar7 * x->i;
          }
          lVar5 = lVar5 + 1;
          x = x + 1;
        } while (lVar5 < *n);
      }
      *kase = 2;
      *isave = 4;
      return 0;
    }
LAB_00119f32:
    uVar1 = *n;
    if (0 < (int)uVar1) {
      fVar7 = 1.0;
      uVar4 = 0;
      do {
        x[uVar4].r = ((float)(int)uVar4 / (float)(int)(uVar1 - 1) + 1.0) * fVar7;
        x[uVar4].i = 0.0;
        fVar7 = -fVar7;
        uVar4 = uVar4 + 1;
      } while (uVar1 != uVar4);
    }
    *kase = 1;
    *isave = 5;
    return 0;
  case 4:
    iVar2 = isave[1];
    iVar3 = icmax1_slu(n,x,&local_3c);
    isave[1] = iVar3 + -1;
    if (((x[iVar2].r == ABS(x[(long)iVar3 + -1].r)) &&
        (!NAN(x[iVar2].r) && !NAN(ABS(x[(long)iVar3 + -1].r)))) || (4 < isave[2]))
    goto LAB_00119f32;
    isave[2] = isave[2] + 1;
LAB_00119de5:
    if (0 < *n) {
      lVar5 = 0;
      do {
        x[lVar5].r = 0.0;
        x[lVar5].i = 0.0;
        lVar5 = lVar5 + 1;
      } while (lVar5 < *n);
    }
    iVar2 = isave[1];
    x[iVar2].r = 1.0;
    x[iVar2].i = 0.0;
    *kase = 1;
    *isave = 3;
    return 0;
  case 5:
    dVar6 = scsum1_slu(n,x,&local_3c);
    dVar6 = dVar6 / (double)(*n * 3);
    local_38 = (float)(dVar6 + dVar6);
    if (local_38 < *est || local_38 == *est) goto LAB_00119fc8;
    ccopy_(n,x,&local_3c,v,&local_3c);
    break;
  default:
    if (*n != 1) {
      dVar6 = scsum1_slu(n,x,&local_3c);
      *est = (float)dVar6;
      if (0 < *n) {
        lVar5 = 0;
        do {
          dVar6 = c_abs(x);
          if ((float)dVar6 <= local_38) {
            x->r = 1.0;
            x->i = 0.0;
          }
          else {
            fVar7 = 1.0 / (float)dVar6;
            x->r = x->r * fVar7;
            x->i = fVar7 * x->i;
          }
          lVar5 = lVar5 + 1;
          x = x + 1;
        } while (lVar5 < *n);
      }
      iVar2 = 2;
      goto LAB_00119d8c;
    }
    *v = *x;
    dVar6 = c_abs(v);
    local_38 = (float)dVar6;
  }
  *est = local_38;
LAB_00119fc8:
  *kase = 0;
  return 0;
}

Assistant:

int
clacon2_(int *n, singlecomplex *v, singlecomplex *x, float *est, int *kase, int isave[3])
{
    /* Table of constant values */
    int c__1 = 1;
    singlecomplex      zero = {0.0, 0.0};
    singlecomplex      one = {1.0, 0.0};

    /* System generated locals */
    float d__1;
    
    /* Local variables */
    int jlast;
    float altsgn, estold;
    int i;
    float temp;
    float safmin;
    extern float smach(char *);
    extern int icmax1_slu(int *, singlecomplex *, int *);
    extern double scsum1_slu(int *, singlecomplex *, int *);
    extern void ccopy_(int *, singlecomplex *, int *, singlecomplex *, int *);

    safmin = smach("Safe minimum");
    if ( *kase == 0 ) {
	for (i = 0; i < *n; ++i) {
	    x[i].r = 1. / (float) (*n);
	    x[i].i = 0.;
	}
	*kase = 1;
	isave[0] = 1;	/* jump = 1; */
	return 0;
    }

    switch (isave[0]) {
	case 1:  goto L20;
	case 2:  goto L40;
	case 3:  goto L70;
	case 4:  goto L110;
	case 5:  goto L140;
    }

    /*     ................ ENTRY   (isave[0] == 1)   
	   FIRST ITERATION.  X HAS BEEN OVERWRITTEN BY A*X. */
  L20:
    if (*n == 1) {
	v[0] = x[0];
	*est = c_abs(&v[0]);
	/*        ... QUIT */
	goto L150;
    }
    *est = scsum1_slu(n, x, &c__1);

    for (i = 0; i < *n; ++i) {
	d__1 = c_abs(&x[i]);
	if (d__1 > safmin) {
	    d__1 = 1 / d__1;
	    x[i].r *= d__1;
	    x[i].i *= d__1;
	} else {
	    x[i] = one;
	}
    }
    *kase = 2;
    isave[0] = 2;  /* jump = 2; */
    return 0;

    /*     ................ ENTRY   (isave[0] == 2)   
	   FIRST ITERATION.  X HAS BEEN OVERWRITTEN BY TRANSPOSE(A)*X. */
L40:
    isave[1] = icmax1_slu(n, &x[0], &c__1);  /* j */
    --isave[1];  /* --j; */
    isave[2] = 2; /* iter = 2; */

    /*     MAIN LOOP - ITERATIONS 2,3,...,ITMAX. */
L50:
    for (i = 0; i < *n; ++i) x[i] = zero;
    x[isave[1]] = one;
    *kase = 1;
    isave[0] = 3;  /* jump = 3; */
    return 0;

    /*     ................ ENTRY   (isave[0] == 3)   
	   X HAS BEEN OVERWRITTEN BY A*X. */
L70:
#ifdef _CRAY
    CCOPY(n, x, &c__1, v, &c__1);
#else
    ccopy_(n, x, &c__1, v, &c__1);
#endif
    estold = *est;
    *est = scsum1_slu(n, v, &c__1);


L90:
    /*     TEST FOR CYCLING. */
    if (*est <= estold) goto L120;

    for (i = 0; i < *n; ++i) {
	d__1 = c_abs(&x[i]);
	if (d__1 > safmin) {
	    d__1 = 1 / d__1;
	    x[i].r *= d__1;
	    x[i].i *= d__1;
	} else {
	    x[i] = one;
	}
    }
    *kase = 2;
    isave[0] = 4;  /* jump = 4; */
    return 0;

    /*     ................ ENTRY   (isave[0] == 4)
	   X HAS BEEN OVERWRITTEN BY TRANSPOSE(A)*X. */
L110:
    jlast = isave[1];  /* j; */
    isave[1] = icmax1_slu(n, &x[0], &c__1); /* j */
    isave[1] = isave[1] - 1;  /* --j; */
    if (x[jlast].r != (d__1 = x[isave[1]].r, fabs(d__1)) && isave[2] < 5) {
	isave[2] = isave[2] + 1;  /* ++iter; */
	goto L50;
    }

    /*     ITERATION COMPLETE.  FINAL STAGE. */
L120:
    altsgn = 1.;
    for (i = 1; i <= *n; ++i) {
	x[i-1].r = altsgn * ((float)(i - 1) / (float)(*n - 1) + 1.);
	x[i-1].i = 0.;
	altsgn = -altsgn;
    }
    *kase = 1;
    isave[0] = 5;  /* jump = 5; */
    return 0;
    
    /*     ................ ENTRY   (isave[0] = 5)   
	   X HAS BEEN OVERWRITTEN BY A*X. */
L140:
    temp = scsum1_slu(n, x, &c__1) / (float)(*n * 3) * 2.;
    if (temp > *est) {
#ifdef _CRAY
	CCOPY(n, &x[0], &c__1, &v[0], &c__1);
#else
	ccopy_(n, &x[0], &c__1, &v[0], &c__1);
#endif
	*est = temp;
    }

L150:
    *kase = 0;
    return 0;

}